

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSSBOLayoutTests.cpp
# Opt level: O2

void __thiscall
vkt::ssbo::anon_unknown_0::BlockMultiNestedStructCase::BlockMultiNestedStructCase
          (BlockMultiNestedStructCase *this,TestContext *testCtx,char *name,char *description,
          deUint32 flagsA,deUint32 flagsB,BufferMode bufferMode,int numInstances,
          MatrixLoadFlags matrixLoadFlag)

{
  ShaderInterface *this_00;
  vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_> *pvVar1;
  StructType *this_01;
  StructType *this_02;
  BufferBlock *this_03;
  BufferBlock *this_04;
  VarType VStack_88;
  BufferVar local_70;
  
  SSBOLayoutCase::SSBOLayoutCase(&this->super_SSBOLayoutCase,testCtx,name,"",flagsB,numInstances);
  (this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__SSBOLayoutCase_00c03de0;
  this->m_flagsA = (deUint32)description;
  this->m_flagsB = flagsA;
  this->m_numInstances = bufferMode;
  this_00 = &(this->super_SSBOLayoutCase).m_interface;
  this_01 = ShaderInterface::allocStruct(this_00,"S");
  glu::VarType::VarType((VarType *)&local_70,TYPE_FLOAT_MAT3,PRECISION_LOWP);
  glu::StructType::addMember(this_01,"a",(VarType *)&local_70);
  glu::VarType::~VarType((VarType *)&local_70);
  glu::VarType::VarType(&VStack_88,TYPE_INT_VEC2,PRECISION_MEDIUMP);
  glu::VarType::VarType((VarType *)&local_70,&VStack_88,4);
  glu::StructType::addMember(this_01,"b",(VarType *)&local_70);
  glu::VarType::~VarType((VarType *)&local_70);
  glu::VarType::~VarType(&VStack_88);
  glu::VarType::VarType((VarType *)&local_70,TYPE_FLOAT_VEC4,PRECISION_HIGHP);
  glu::StructType::addMember(this_01,"c",(VarType *)&local_70);
  glu::VarType::~VarType((VarType *)&local_70);
  this_02 = ShaderInterface::allocStruct(this_00,"T");
  glu::VarType::VarType((VarType *)&local_70,TYPE_UINT,PRECISION_MEDIUMP);
  glu::StructType::addMember(this_02,"a",(VarType *)&local_70);
  glu::VarType::~VarType((VarType *)&local_70);
  glu::VarType::VarType((VarType *)&local_70,this_01);
  glu::StructType::addMember(this_02,"b",(VarType *)&local_70);
  glu::VarType::~VarType((VarType *)&local_70);
  glu::VarType::VarType((VarType *)&local_70,TYPE_BOOL_VEC4,PRECISION_LAST);
  glu::StructType::addMember(this_02,"c",(VarType *)&local_70);
  glu::VarType::~VarType((VarType *)&local_70);
  this_03 = ShaderInterface::allocBlock(this_00,"BlockA");
  glu::VarType::VarType(&VStack_88,TYPE_FLOAT,PRECISION_HIGHP);
  BufferVar::BufferVar(&local_70,"a",&VStack_88,0x600);
  pvVar1 = &this_03->m_variables;
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::push_back
            (pvVar1,&local_70);
  BufferVar::~BufferVar(&local_70);
  glu::VarType::~VarType(&VStack_88);
  glu::VarType::VarType(&VStack_88,this_01);
  BufferVar::BufferVar(&local_70,"b",&VStack_88,0x400);
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::push_back
            (pvVar1,&local_70);
  BufferVar::~BufferVar(&local_70);
  glu::VarType::~VarType(&VStack_88);
  glu::VarType::VarType(&VStack_88,TYPE_UINT_VEC3,PRECISION_LOWP);
  BufferVar::BufferVar(&local_70,"c",&VStack_88,0);
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::push_back
            (pvVar1,&local_70);
  BufferVar::~BufferVar(&local_70);
  glu::VarType::~VarType(&VStack_88);
  std::__cxx11::string::assign((char *)&this_03->m_instanceName);
  this_03->m_flags = this->m_flagsA;
  this_04 = ShaderInterface::allocBlock(this_00,"BlockB");
  glu::VarType::VarType(&VStack_88,TYPE_FLOAT_MAT2,PRECISION_MEDIUMP);
  BufferVar::BufferVar(&local_70,"a",&VStack_88,0x400);
  pvVar1 = &this_04->m_variables;
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::push_back
            (pvVar1,&local_70);
  BufferVar::~BufferVar(&local_70);
  glu::VarType::~VarType(&VStack_88);
  glu::VarType::VarType(&VStack_88,this_02);
  BufferVar::BufferVar(&local_70,"b",&VStack_88,0x600);
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::push_back
            (pvVar1,&local_70);
  BufferVar::~BufferVar(&local_70);
  glu::VarType::~VarType(&VStack_88);
  glu::VarType::VarType(&VStack_88,TYPE_BOOL_VEC4,PRECISION_LAST);
  BufferVar::BufferVar(&local_70,"c",&VStack_88,0);
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::push_back
            (pvVar1,&local_70);
  BufferVar::~BufferVar(&local_70);
  glu::VarType::~VarType(&VStack_88);
  glu::VarType::VarType(&VStack_88,TYPE_BOOL,PRECISION_LAST);
  BufferVar::BufferVar(&local_70,"d",&VStack_88,0x600);
  std::vector<vkt::ssbo::BufferVar,_std::allocator<vkt::ssbo::BufferVar>_>::push_back
            (pvVar1,&local_70);
  BufferVar::~BufferVar(&local_70);
  glu::VarType::~VarType(&VStack_88);
  std::__cxx11::string::assign((char *)&this_04->m_instanceName);
  this_04->m_flags = this->m_flagsB;
  if (0 < this->m_numInstances) {
    BufferBlock::setArraySize(this_03,this->m_numInstances);
    BufferBlock::setArraySize(this_04,this->m_numInstances);
  }
  (*(this->super_SSBOLayoutCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[2])
            (this);
  return;
}

Assistant:

BlockMultiNestedStructCase (tcu::TestContext& testCtx, const char* name, const char* description, deUint32 flagsA, deUint32 flagsB, BufferMode bufferMode, int numInstances, MatrixLoadFlags matrixLoadFlag)
		: SSBOLayoutCase	(testCtx, name, description, bufferMode, matrixLoadFlag)
		, m_flagsA			(flagsA)
		, m_flagsB			(flagsB)
		, m_numInstances	(numInstances)
	{
		StructType& typeS = m_interface.allocStruct("S");
		typeS.addMember("a", VarType(glu::TYPE_FLOAT_MAT3, glu::PRECISION_LOWP));
		typeS.addMember("b", VarType(VarType(glu::TYPE_INT_VEC2, glu::PRECISION_MEDIUMP), 4));
		typeS.addMember("c", VarType(glu::TYPE_FLOAT_VEC4, glu::PRECISION_HIGHP));

		StructType& typeT = m_interface.allocStruct("T");
		typeT.addMember("a", VarType(glu::TYPE_UINT, glu::PRECISION_MEDIUMP)); // \todo [pyry] UNUSED
		typeT.addMember("b", VarType(&typeS));
		typeT.addMember("c", VarType(glu::TYPE_BOOL_VEC4, glu::PRECISION_LAST));

		BufferBlock& blockA = m_interface.allocBlock("BlockA");
		blockA.addMember(BufferVar("a", VarType(glu::TYPE_FLOAT, glu::PRECISION_HIGHP), ACCESS_READ|ACCESS_WRITE));
		blockA.addMember(BufferVar("b", VarType(&typeS), ACCESS_WRITE));
		blockA.addMember(BufferVar("c", VarType(glu::TYPE_UINT_VEC3, glu::PRECISION_LOWP), 0 /* no access */));
		blockA.setInstanceName("blockA");
		blockA.setFlags(m_flagsA);

		BufferBlock& blockB = m_interface.allocBlock("BlockB");
		blockB.addMember(BufferVar("a", VarType(glu::TYPE_FLOAT_MAT2, glu::PRECISION_MEDIUMP), ACCESS_WRITE));
		blockB.addMember(BufferVar("b", VarType(&typeT), ACCESS_READ|ACCESS_WRITE));
		blockB.addMember(BufferVar("c", VarType(glu::TYPE_BOOL_VEC4, glu::PRECISION_LAST), 0 /* no access */));
		blockB.addMember(BufferVar("d", VarType(glu::TYPE_BOOL, glu::PRECISION_LAST), ACCESS_READ|ACCESS_WRITE));
		blockB.setInstanceName("blockB");
		blockB.setFlags(m_flagsB);

		if (m_numInstances > 0)
		{
			blockA.setArraySize(m_numInstances);
			blockB.setArraySize(m_numInstances);
		}

		init();
	}